

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O1

bool duckdb::ShouldRenderWhitespace(RenderTree *root,idx_t x,idx_t y)

{
  byte in_AL;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  optional_ptr<duckdb::RenderTreeNode,_true> node;
  optional_ptr<duckdb::RenderTreeNode,_true> local_38;
  
  uVar3 = 0;
  while( true ) {
    local_38 = RenderTree::GetNode(root,x,y);
    bVar1 = RenderTree::HasNode(root,x,y + 1);
    uVar3 = bVar1 + uVar3;
    if (local_38.ptr == (RenderTreeNode *)0x0) {
      cVar2 = (x == 0) * '\x02';
    }
    else {
      optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid(&local_38);
      if (((ulong)((long)((local_38.ptr)->child_positions).
                         super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                         .
                         super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)((local_38.ptr)->child_positions).
                        super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                        .
                        super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                        ._M_impl.super__Vector_impl_data._M_start) < 0x11) ||
         (optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid(&local_38),
         (ulong)((long)((local_38.ptr)->child_positions).
                       super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                       .
                       super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)((local_38.ptr)->child_positions).
                       super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                       .
                       super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar3)) {
        cVar2 = '\x01';
        in_AL = 0;
      }
      else {
        cVar2 = '\x01';
        in_AL = 1;
      }
    }
    if (cVar2 != '\0') break;
    x = x - 1;
  }
  if (cVar2 == '\x02') {
    in_AL = 0;
  }
  return (bool)(in_AL & 1);
}

Assistant:

static bool ShouldRenderWhitespace(RenderTree &root, idx_t x, idx_t y) {
	idx_t found_children = 0;
	for (;; x--) {
		auto node = root.GetNode(x, y);
		if (root.HasNode(x, y + 1)) {
			found_children++;
		}
		if (node) {
			if (NodeHasMultipleChildren(*node)) {
				if (found_children < node->child_positions.size()) {
					return true;
				}
			}
			return false;
		}
		if (x == 0) {
			break;
		}
	}
	return false;
}